

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_cstring.hpp
# Opt level: O2

self_type * __thiscall
boost::unit_test::basic_cstring<const_char>::trim_right
          (basic_cstring<const_char> *this,self_type *exclusions)

{
  iterator pvVar1;
  const_char *pcVar2;
  iterator pvVar3;
  
  if (exclusions->m_end == exclusions->m_begin) {
    exclusions->m_begin = " \t\nN5boost7runtime14invalid_cla_idE";
    exclusions->m_end = "N5boost7runtime14invalid_cla_idE";
  }
  pvVar1 = this->m_end;
  do {
    pvVar3 = pvVar1;
    if (pvVar3 == this->m_begin) {
      this->m_end = pvVar3;
      goto LAB_0019a81c;
    }
    pcVar2 = ut_detail::bcs_char_traits_impl<const_char>::find
                       (exclusions->m_begin,(long)exclusions->m_end - (long)exclusions->m_begin,
                        pvVar3[-1]);
    pvVar1 = pvVar3 + -1;
  } while (pcVar2 != (const_char *)0x0);
  this->m_end = pvVar3;
  if (pvVar3 <= this->m_begin) {
LAB_0019a81c:
    this->m_begin = pvVar3;
  }
  return this;
}

Assistant:

inline basic_cstring<CharT>&
basic_cstring<CharT>::trim_right( basic_cstring exclusions )
{
    if( exclusions.is_empty() )
        exclusions = default_trim_ex();

    iterator it;

    for( it = end()-1; it != begin()-1; --it ) {
        if( self_type::traits_type::find( exclusions.begin(),  exclusions.size(), *it ) == reinterpret_cast<pointer>(0) )
            break;
    }

    return trim_right( it+1 );
}